

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipUtilities.hpp
# Opt level: O0

string * Zippy::Impl::GenerateRandomName_abi_cxx11_(int length)

{
  result_type_conflict1 __a;
  int in_ESI;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_RDI;
  int i;
  string result;
  uniform_int_distribution<int> distr;
  mt19937 generator;
  random_device rand_dev;
  string letters;
  result_type in_stack_ffffffffffffd858;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  int local_2784;
  char *in_stack_ffffffffffffd880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd888;
  allocator<char> *in_stack_ffffffffffffd890;
  char *in_stack_ffffffffffffd898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd8a0;
  undefined1 local_31 [37];
  int local_c;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_31;
  this = in_RDI;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd898,in_stack_ffffffffffffd890);
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  std::random_device::random_device((random_device *)in_stack_ffffffffffffd8a0);
  __a = std::random_device::operator()((random_device *)0x172c69);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(this,CONCAT44(__a,in_stack_ffffffffffffd858));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_31 + 1));
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)this,__a,in_stack_ffffffffffffd858);
  std::__cxx11::string::string(this_00);
  for (local_2784 = 0; local_2784 < local_c; local_2784 = local_2784 + 1) {
    in_stack_ffffffffffffd858 =
         std::uniform_int_distribution<int>::operator()
                   ((uniform_int_distribution<int> *)this,
                    (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     *)CONCAT44(__a,in_stack_ffffffffffffd858));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               CONCAT44(__a,in_stack_ffffffffffffd858));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (char)(__a >> 0x18));
  }
  std::operator+(in_stack_ffffffffffffd888,in_stack_ffffffffffffd880);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::random_device::~random_device((random_device *)0x172dae);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  return (string *)in_RDI;
}

Assistant:

inline std::string GenerateRandomName(int length) {

        std::string letters = "abcdefghijklmnopqrstuvwxyz0123456789";

        std::random_device                 rand_dev;
        std::mt19937                       generator(rand_dev());
        std::uniform_int_distribution<int> distr(0, letters.size() - 1);

        std::string result;
        for (int    i       = 0; i < length; ++i) {
            result += letters[distr(generator)];
        }

        return result + ".tmp";
    }